

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_tree_clusterizer.h
# Opt level: O2

void __thiscall
crnlib::tree_clusterizer<crnlib::vec<6U,_float>_>::split_alternative_node_task
          (tree_clusterizer<crnlib::vec<6U,_float>_> *this,uint64 param_1,void *pData_ptr)

{
  vq_node *pvVar1;
  bool bVar2;
  uint uVar3;
  priority_queue<crnlib::tree_clusterizer<crnlib::vec<6U,_float>_>::NodeInfo,_std::vector<crnlib::tree_clusterizer<crnlib::vec<6U,_float>_>::NodeInfo,_std::allocator<crnlib::tree_clusterizer<crnlib::vec<6U,_float>_>::NodeInfo>_>,_std::less<crnlib::tree_clusterizer<crnlib::vec<6U,_float>_>::NodeInfo>_>
  node_queue;
  uint local_5c;
  priority_queue<crnlib::tree_clusterizer<crnlib::vec<6U,_float>_>::NodeInfo,_std::vector<crnlib::tree_clusterizer<crnlib::vec<6U,_float>_>::NodeInfo,_std::allocator<crnlib::tree_clusterizer<crnlib::vec<6U,_float>_>::NodeInfo>_>,_std::less<crnlib::tree_clusterizer<crnlib::vec<6U,_float>_>::NodeInfo>_>
  local_58;
  value_type local_30;
  
  local_58.c.
  super__Vector_base<crnlib::tree_clusterizer<crnlib::vec<6U,_float>_>::NodeInfo,_std::allocator<crnlib::tree_clusterizer<crnlib::vec<6U,_float>_>::NodeInfo>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_58.c.
  super__Vector_base<crnlib::tree_clusterizer<crnlib::vec<6U,_float>_>::NodeInfo,_std::allocator<crnlib::tree_clusterizer<crnlib::vec<6U,_float>_>::NodeInfo>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_58.c.
  super__Vector_base<crnlib::tree_clusterizer<crnlib::vec<6U,_float>_>::NodeInfo,_std::allocator<crnlib::tree_clusterizer<crnlib::vec<6U,_float>_>::NodeInfo>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  uVar3 = *(uint *)((long)pData_ptr + 4);
  pvVar1 = (this->m_nodes).m_p;
  vq_node::operator=(pvVar1 + uVar3,pvVar1 + *pData_ptr);
  local_30.m_variance = (this->m_nodes).m_p[uVar3].m_variance;
  local_30.m_index = uVar3;
  std::
  priority_queue<crnlib::tree_clusterizer<crnlib::vec<6U,_float>_>::NodeInfo,_std::vector<crnlib::tree_clusterizer<crnlib::vec<6U,_float>_>::NodeInfo,_std::allocator<crnlib::tree_clusterizer<crnlib::vec<6U,_float>_>::NodeInfo>_>,_std::less<crnlib::tree_clusterizer<crnlib::vec<6U,_float>_>::NodeInfo>_>
  ::push(&local_58,&local_30);
  local_5c = uVar3 + 1;
  uVar3 = 0;
  do {
    uVar3 = uVar3 + 1;
    if (*(uint *)((long)pData_ptr + 8) <= uVar3) break;
    bVar2 = split_node(this,&local_58,&local_5c,(task_pool *)0x0);
  } while (bVar2);
  pvVar1 = (this->m_nodes).m_p;
  vq_node::operator=(pvVar1 + *pData_ptr,pvVar1 + *(uint *)((long)pData_ptr + 4));
  (this->m_nodes).m_p[*pData_ptr].m_alternative = true;
  std::
  _Vector_base<crnlib::tree_clusterizer<crnlib::vec<6U,_float>_>::NodeInfo,_std::allocator<crnlib::tree_clusterizer<crnlib::vec<6U,_float>_>::NodeInfo>_>
  ::~_Vector_base((_Vector_base<crnlib::tree_clusterizer<crnlib::vec<6U,_float>_>::NodeInfo,_std::allocator<crnlib::tree_clusterizer<crnlib::vec<6U,_float>_>::NodeInfo>_>
                   *)&local_58);
  return;
}

Assistant:

void split_alternative_node_task(uint64, void* pData_ptr) {
    split_alternative_node_task_params* pParams = (split_alternative_node_task_params*)pData_ptr;
    std::priority_queue<NodeInfo> node_queue;
    uint begin_node = pParams->alternative_node, end_node = begin_node, splits = 0;

    m_nodes[end_node] = m_nodes[pParams->main_node];
    node_queue.push(NodeInfo(end_node, m_nodes[end_node].m_variance));
    end_node++;
    splits++;

    while (splits < pParams->max_splits && split_node(node_queue, end_node))
      splits++;

    m_nodes[pParams->main_node] = m_nodes[pParams->alternative_node];
    m_nodes[pParams->main_node].m_alternative = true;
  }